

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionVectorVerifySignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  string *local_48;
  string *type;
  string name;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  name.field_2._8_8_ = enum_def;
  Name_abi_cxx11_((string *)&type,this,&enum_def->super_Definition);
  if (((this->opts_).super_IDLOptions.scoped_enums & 1U) == 0) {
    GenTypeBasic_abi_cxx11_(&local_68,this,(Type *)(name.field_2._8_8_ + 0xd0),false);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&type);
  }
  local_48 = &local_68;
  std::operator+(&local_138,"bool Verify",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
  std::operator+(&local_118,&local_138,"Vector");
  std::operator+(&local_f8,&local_118,"(::flatbuffers::Verifier &verifier, ");
  std::operator+(&local_d8,&local_f8,
                 "const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, ");
  std::operator+(&local_b8,&local_d8,"const ::flatbuffers::Vector<");
  std::operator+(&local_98,&local_b8,local_48);
  std::operator+(__return_storage_ptr__,&local_98,"> *types)");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&type);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionVectorVerifySignature(const EnumDef &enum_def) {
    const std::string name = Name(enum_def);
    const std::string &type =
        opts_.scoped_enums ? name
                           : GenTypeBasic(enum_def.underlying_type, false);
    return "bool Verify" + name + "Vector" +
           "(::flatbuffers::Verifier &verifier, " +
           "const ::flatbuffers::Vector<::flatbuffers::Offset<void>> "
           "*values, " +
           "const ::flatbuffers::Vector<" + type + "> *types)";
  }